

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O0

int amrex::EB2::maxCoarseningLevel(IndexSpace *ebis,Geometry *geom)

{
  uint uVar1;
  undefined8 uVar2;
  Box cdomain_00;
  int iVar3;
  undefined8 *puVar4;
  Geometry *in_RSI;
  long *in_RDI;
  Box *cdomain;
  Box bx;
  Box *domain;
  int i;
  undefined1 in_stack_ffffffffffffff34 [12];
  undefined8 *puVar5;
  undefined8 local_8c;
  undefined8 local_84;
  undefined8 local_7c;
  undefined4 local_74;
  undefined8 *local_70;
  long *local_60;
  Box *local_58;
  int local_4c;
  undefined8 *local_48;
  int local_3c;
  undefined4 *local_38;
  undefined4 local_30;
  int local_2c;
  long local_28;
  undefined4 *local_20;
  int local_14;
  undefined4 *local_10;
  int local_4;
  
  local_60 = in_RDI;
  local_58 = Geometry::Domain(in_RSI);
  local_8c = *(undefined8 *)(local_58->smallend).vect;
  local_84 = *(undefined8 *)((local_58->smallend).vect + 2);
  uVar2 = *(undefined8 *)((local_58->bigend).vect + 1);
  uVar1 = (local_58->btype).itype;
  puVar5 = &local_8c;
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    local_38 = &local_74;
    local_3c = local_4c;
    local_14 = local_4c;
    local_4 = local_4c;
    if ((uVar1 & 1 << ((byte)local_4c & 0x1f)) != 0) {
      local_28 = (long)&local_84 + 4;
      local_2c = local_4c;
      local_30 = 0xffffffff;
      *(int *)(local_28 + (long)local_4c * 4) = *(int *)(local_28 + (long)local_4c * 4) + -1;
    }
    local_10 = local_38;
  }
  local_20 = &local_74;
  local_74 = 0;
  local_70 = &local_8c;
  local_7c = uVar2;
  local_48 = puVar5;
  puVar4 = (undefined8 *)(**(code **)(*local_60 + 0x20))();
  cdomain_00.smallend.vect[1] = in_stack_ffffffffffffff34._0_4_;
  cdomain_00.smallend.vect[2] = in_stack_ffffffffffffff34._4_4_;
  cdomain_00.bigend.vect[0] = in_stack_ffffffffffffff34._8_4_;
  cdomain_00.smallend.vect[0] = *(undefined4 *)(puVar4 + 3);
  cdomain_00.bigend.vect._4_8_ = puVar5;
  cdomain_00.btype.itype = (uint)*puVar4;
  iVar3 = anon_unknown_45::comp_max_crse_level(cdomain_00,(Box *)puVar4[1]);
  return iVar3;
}

Assistant:

int
maxCoarseningLevel (IndexSpace const* ebis, const Geometry& geom)
{
    const Box& domain = amrex::enclosedCells(geom.Domain());
    const Box& cdomain = ebis->coarsestDomain();
    return comp_max_crse_level(cdomain,domain);
}